

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  sqlite3 *psVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  ushort *puVar8;
  byte *pbVar9;
  ushort *puVar10;
  byte *pbVar11;
  uint uVar12;
  undefined7 in_register_00000031;
  byte *pbVar13;
  long lVar14;
  uint uVar15;
  ushort *puVar16;
  
  if (((int)CONCAT71(in_register_00000031,desiredEnc) == 1) || (pMem->enc == '\x01')) {
    uVar15 = pMem->n;
    if (desiredEnc == '\x01') {
      uVar15 = uVar15 & 0xfffffffe;
      pMem->n = uVar15;
      iVar6 = uVar15 * 2 + 1;
    }
    else {
      iVar6 = uVar15 * 2 + 2;
    }
    puVar10 = (ushort *)pMem->z;
    if (pMem->db == (sqlite3 *)0x0) {
      pbVar9 = (byte *)sqlite3Malloc((long)iVar6);
    }
    else {
      pbVar9 = (byte *)sqlite3DbMallocRawNN(pMem->db,(long)iVar6);
    }
    if (pbVar9 == (byte *)0x0) {
      return 7;
    }
    puVar8 = (ushort *)((long)(int)uVar15 + (long)puVar10);
    if (pMem->enc == '\x01') {
      pbVar11 = pbVar9;
      if (desiredEnc == '\x02') {
        if (0 < (int)uVar15) {
          do {
            bVar2 = (byte)*puVar10;
            puVar16 = (ushort *)((long)puVar10 + 1);
            puVar10 = puVar16;
            uVar15 = (uint)bVar2;
            if (bVar2 < 0xc0) {
LAB_0013c4c7:
              *(short *)pbVar11 = (short)uVar15;
              pbVar11 = pbVar11 + 2;
            }
            else {
              uVar12 = (uint)""[bVar2 - 0xc0];
              while ((puVar10 = puVar8, puVar16 != puVar8 &&
                     (uVar3 = *puVar16, puVar10 = puVar16, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
                puVar16 = (ushort *)((long)puVar16 + 1);
                uVar12 = (byte)uVar3 & 0x3f | uVar12 << 6;
              }
              uVar15 = 0xfffd;
              if ((((uVar12 & 0xfffffffe) == 0xfffe) || (uVar12 < 0x80)) ||
                 (((uVar12 & 0xfffff800) == 0xd800 || (uVar15 = uVar12, uVar12 < 0x10000))))
              goto LAB_0013c4c7;
              *pbVar11 = (byte)(uVar12 - 0x10000 >> 10) & 0xc0 | (byte)(uVar12 >> 10) & 0x3f;
              pbVar11[1] = (byte)(uVar12 - 0x10000 >> 0x12) & 3 | 0xd8;
              pbVar11[2] = (byte)uVar12;
              pbVar11[3] = (byte)(uVar12 >> 8) & 3 | 0xdc;
              pbVar11 = pbVar11 + 4;
            }
          } while (puVar10 < puVar8);
        }
      }
      else if (0 < (int)uVar15) {
        do {
          bVar2 = (byte)*puVar10;
          puVar16 = (ushort *)((long)puVar10 + 1);
          puVar10 = puVar16;
          uVar15 = (uint)bVar2;
          if (bVar2 < 0xc0) {
LAB_0013c6e9:
            uVar12 = uVar15;
            pbVar13 = pbVar11 + 1;
            *pbVar11 = (byte)(uVar12 >> 8);
            lVar14 = 2;
          }
          else {
            uVar12 = (uint)""[bVar2 - 0xc0];
            while ((puVar10 = puVar8, puVar16 != puVar8 &&
                   (uVar3 = *puVar16, puVar10 = puVar16, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
              puVar16 = (ushort *)((long)puVar16 + 1);
              uVar12 = (byte)uVar3 & 0x3f | uVar12 << 6;
            }
            uVar15 = 0xfffd;
            if (((((uVar12 & 0xfffffffe) == 0xfffe) || (uVar12 < 0x80)) ||
                ((uVar12 & 0xfffff800) == 0xd800)) || (uVar15 = uVar12, uVar12 < 0x10000))
            goto LAB_0013c6e9;
            *pbVar11 = (byte)(uVar12 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar11[1] = (byte)(uVar12 - 0x10000 >> 10) & 0xc0 | (byte)(uVar12 >> 10) & 0x3f;
            pbVar13 = pbVar11 + 3;
            pbVar11[2] = (byte)(uVar12 >> 8) & 3 | 0xdc;
            lVar14 = 4;
          }
          pbVar11 = pbVar11 + lVar14;
          *pbVar13 = (byte)uVar12;
        } while (puVar10 < puVar8);
      }
      pMem->n = (int)pbVar11 - (int)pbVar9;
      *pbVar11 = 0;
      pbVar11 = pbVar11 + 1;
    }
    else {
      pbVar11 = pbVar9;
      if (pMem->enc == '\x02') {
        if (0 < (int)uVar15) {
          do {
            bVar2 = (byte)*puVar10;
            puVar16 = puVar10 + 1;
            bVar1 = *(byte *)((long)puVar10 + 1);
            uVar3 = *puVar10;
            if (((bVar1 & 0xf8) == 0xd8) && (puVar16 < puVar8)) {
              uVar5 = puVar10[1];
              bVar1 = *(byte *)((long)puVar10 + 3);
              puVar16 = puVar10 + 2;
              iVar6 = (uVar3 & 0x3c0) * 0x400;
              *pbVar11 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
              pbVar11[1] = (byte)(iVar6 + ((uint)bVar2 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f |
                           0x80;
              pbVar11[2] = (byte)(((bVar1 & 3) << 8 | (uint)(byte)uVar5 | (uint)bVar2 << 10) >> 6) &
                           0x3f | 0x80;
              pbVar11[3] = (byte)uVar5 & 0x3f | 0x80;
              pbVar11 = pbVar11 + 4;
            }
            else if (uVar3 < 0x80) {
              *pbVar11 = bVar2;
              pbVar11 = pbVar11 + 1;
            }
            else if (bVar1 < 8) {
              *pbVar11 = (byte)(uVar3 >> 6) | 0xc0;
              pbVar11[1] = bVar2 & 0x3f | 0x80;
              pbVar11 = pbVar11 + 2;
            }
            else {
              *pbVar11 = bVar1 >> 4 | 0xe0;
              pbVar11[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
              pbVar11[2] = bVar2 & 0x3f | 0x80;
              pbVar11 = pbVar11 + 3;
            }
            puVar10 = puVar16;
          } while (puVar16 < puVar8);
        }
      }
      else if (0 < (int)uVar15) {
        do {
          bVar2 = (byte)*puVar10;
          puVar16 = puVar10 + 1;
          bVar1 = *(byte *)((long)puVar10 + 1);
          uVar3 = CONCAT11(bVar2,bVar1);
          if (((bVar2 & 0xf8) == 0xd8) && (puVar16 < puVar8)) {
            uVar5 = puVar10[1];
            bVar2 = *(byte *)((long)puVar10 + 3);
            puVar16 = puVar10 + 2;
            iVar6 = (uVar3 & 0x3c0) * 0x400;
            *pbVar11 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
            pbVar11[1] = (byte)(iVar6 + ((uint)bVar1 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80
            ;
            pbVar11[2] = (byte)((((byte)uVar5 & 3) << 8 | (uint)bVar2 | (uint)bVar1 << 10) >> 6) &
                         0x3f | 0x80;
            pbVar11[3] = bVar2 & 0x3f | 0x80;
            pbVar11 = pbVar11 + 4;
          }
          else if (uVar3 < 0x80) {
            *pbVar11 = bVar1;
            pbVar11 = pbVar11 + 1;
          }
          else if (bVar2 < 8) {
            *pbVar11 = (byte)(uVar3 >> 6) | 0xc0;
            pbVar11[1] = bVar1 & 0x3f | 0x80;
            pbVar11 = pbVar11 + 2;
          }
          else {
            *pbVar11 = bVar2 >> 4 | 0xe0;
            pbVar11[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
            pbVar11[2] = bVar1 & 0x3f | 0x80;
            pbVar11 = pbVar11 + 3;
          }
          puVar10 = puVar16;
        } while (puVar16 < puVar8);
      }
      pMem->n = (int)pbVar11 - (int)pbVar9;
    }
    *pbVar11 = 0;
    uVar3 = pMem->flags;
    if (((uVar3 & 0x2400) != 0) || (pMem->szMalloc != 0)) {
      vdbeMemClear(pMem);
    }
    pMem->flags = uVar3 & 0x801d | 0x202;
    pMem->enc = desiredEnc;
    pMem->z = (char *)pbVar9;
    pMem->zMalloc = (char *)pbVar9;
    psVar4 = pMem->db;
    if (((psVar4 == (sqlite3 *)0x0) || (pbVar9 < (psVar4->lookaside).pStart)) ||
       ((psVar4->lookaside).pEnd <= pbVar9)) {
      uVar15 = (*sqlite3Config.m.xSize)(pbVar9);
    }
    else {
      uVar15 = (uint)(psVar4->lookaside).sz;
    }
    pMem->szMalloc = uVar15;
  }
  else {
    iVar6 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar6 != 0) {
      return 7;
    }
    uVar7 = (long)pMem->n & 0xfffffffffffffffe;
    if (0 < (int)uVar7) {
      puVar10 = (ushort *)pMem->z;
      puVar8 = (ushort *)(uVar7 + (long)puVar10);
      do {
        *puVar10 = *puVar10 << 8 | *puVar10 >> 8;
        puVar10 = puVar10 + 1;
      } while (puVar10 < puVar8);
    }
    pMem->enc = desiredEnc;
  }
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  int len;                    /* Maximum length of output string in bytes */
  unsigned char *zOut;                  /* Output buffer */
  unsigned char *zIn;                   /* Input iterator */
  unsigned char *zTerm;                 /* End of input */
  unsigned char *z;                     /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "INPUT:  %s\n", zBuf);
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then 
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM_BKPT;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = pMem->n * 2 + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = pMem->n * 2 + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM_BKPT;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16LE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16BE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = pMem->flags;
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Str|MEM_Term|(c&(MEM_AffMask|MEM_Subtype));
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "OUTPUT: %s\n", zBuf);
  }
#endif
  return SQLITE_OK;
}